

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool dxil_spv::Converter::Impl::scan_samplers
               (ResourceRemappingInterface *iface,MDNode *samplers,ShaderStage stage)

{
  uint uVar1;
  MetadataKind MVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  MDNode *node;
  LoggingCallback p_Var7;
  void *pvVar8;
  uint index;
  bool bVar9;
  VulkanBinding vulkan_binding;
  D3DBinding d3d_binding;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  ShaderStage local_1038;
  undefined1 uStack_1034;
  char cStack_1033;
  char cStack_1032;
  char cStack_1031;
  uint uStack_1030;
  uint uStack_102c;
  uint uStack_1028;
  uint uStack_1024;
  undefined4 uStack_1020;
  undefined1 uStack_101c;
  
  uVar1 = LLVMBC::MDNode::getNumOperands(samplers);
  bVar9 = uVar1 == 0;
  if (!bVar9) {
    index = 0;
    do {
      node = (MDNode *)LLVMBC::MDNode::getOperand(samplers,index);
      MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)node);
      if (MVar2 != Node) {
        p_Var7 = get_thread_log_callback();
        if (p_Var7 == (LoggingCallback)0x0) {
          scan_samplers();
          std::terminate();
        }
        uStack_1028 = 0x63206e69;
        uStack_1024 = 0x3c747361;
        uStack_1020 = 0xa2e3e54;
        uStack_101c = 0;
        local_1038._0_1_ = 'I';
        local_1038._1_1_ = 'n';
        local_1038._2_1_ = 'v';
        local_1038._3_1_ = 'a';
        uStack_1034 = 'l';
        cStack_1033 = 'i';
        cStack_1032 = 'd';
        cStack_1031 = ' ';
        uStack_1030 = 0x65707974;
        uStack_102c = 0x20444920;
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,(char *)&local_1038);
        std::terminate();
      }
      uVar3 = get_constant_metadata<unsigned_int>(node,0);
      uVar4 = get_constant_metadata<unsigned_int>(node,3);
      uVar5 = get_constant_metadata<unsigned_int>(node,4);
      uStack_1024 = get_constant_metadata<unsigned_int>(node,5);
      _local_1038 = CONCAT14(0xe,stage);
      uStack_1020 = 0;
      local_1058 = 0;
      uStack_1050 = 0;
      local_1048 = 0;
      uStack_1030 = uVar3;
      uStack_102c = uVar4;
      uStack_1028 = uVar5;
      if ((iface != (ResourceRemappingInterface *)0x0) &&
         (iVar6 = (*iface->_vptr_ResourceRemappingInterface[3])(iface,&local_1038,&local_1058),
         (char)iVar6 == '\0')) {
        return bVar9;
      }
      index = index + 1;
      bVar9 = uVar1 <= index;
    } while (index != uVar1);
  }
  return bVar9;
}

Assistant:

bool Converter::Impl::scan_samplers(ResourceRemappingInterface *iface, const llvm::MDNode *samplers, ShaderStage stage)
{
	unsigned num_samplers = samplers->getNumOperands();
	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));
		unsigned index = get_constant_metadata(sampler, 0);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		D3DBinding d3d_binding = { stage, DXIL::ResourceKind::Sampler, index, bind_space, bind_register, range_size };
		VulkanBinding vulkan_binding = {};
		if (iface && !iface->remap_sampler(d3d_binding, vulkan_binding))
			return false;
	}

	return true;
}